

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O3

void absl::cord_internal::LogFatalNodeType(CordRep *rep)

{
  AlphaNum *in_RCX;
  string sStack_98;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_48 = 0x16;
  local_40 = "Unexpected node type: ";
  AlphaNum::AlphaNum(&local_78,(uint)rep->tag);
  StrCat_abi_cxx11_(&sStack_98,(absl *)&local_48,&local_78,in_RCX);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.cc"
             ,0x24,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.cc"
                ,0x24,"void absl::cord_internal::LogFatalNodeType(CordRep *)");
}

Assistant:

void LogFatalNodeType(CordRep* rep) {
  ABSL_INTERNAL_LOG(FATAL, absl::StrCat("Unexpected node type: ",
                                        static_cast<int>(rep->tag)));
}